

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pardiso_interface.c
# Opt level: O3

c_int solve_linsys_pardiso(pardiso_solver *s,c_float *b)

{
  long lVar1;
  c_float *pcVar2;
  c_float *pcVar3;
  c_int cVar4;
  long lVar5;
  long lVar6;
  
  s->phase = 0x21;
  pardiso(s->pt,&s->maxfct,&s->mnum,&s->mtype,&s->phase,&s->nKKT,s->KKT->x,s->KKT_p,s->KKT_i,
          &s->idum,&s->nrhs,s->iparm,&s->msglvl,b,s->sol,&s->error);
  if (s->error == 0) {
    if (s->polish == 0) {
      lVar1 = s->n;
      if (0 < lVar1) {
        pcVar2 = s->sol;
        lVar5 = 0;
        do {
          b[lVar5] = pcVar2[lVar5];
          lVar5 = lVar5 + 1;
        } while (lVar1 != lVar5);
      }
      lVar5 = s->m;
      if (0 < lVar5) {
        pcVar2 = s->rho_inv_vec;
        pcVar3 = s->sol;
        lVar6 = 0;
        do {
          b[lVar1 + lVar6] = pcVar2[lVar6] * pcVar3[lVar1 + lVar6] + b[lVar1 + lVar6];
          lVar6 = lVar6 + 1;
        } while (lVar5 != lVar6);
        return 0;
      }
    }
    cVar4 = 0;
  }
  else {
    printf("ERROR in %s: ","solve_linsys_pardiso");
    printf("Error during linear system solution: %d",(ulong)(uint)s->error);
    putchar(10);
    cVar4 = 1;
  }
  return cVar4;
}

Assistant:

c_int solve_linsys_pardiso(pardiso_solver * s, c_float * b) {
    c_int j;

    // Back substitution and iterative refinement
    s->phase = PARDISO_SOLVE;
    pardiso (s->pt, &(s->maxfct), &(s->mnum), &(s->mtype), &(s->phase),
             &(s->nKKT), s->KKT->x, s->KKT_p, s->KKT_i, &(s->idum), &(s->nrhs),
             s->iparm, &(s->msglvl), b, s->sol, &(s->error));
    if ( s->error != 0 ){
#ifdef PRINTING
        c_eprint("Error during linear system solution: %d", (int)s->error);
#endif
        return 1;
    }

    if (!(s->polish)) {
        /* copy x_tilde from s->sol */
        for (j = 0 ; j < s->n ; j++) {
            b[j] = s->sol[j];
        }

        /* compute z_tilde from b and s->sol */
        for (j = 0 ; j < s->m ; j++) {
            b[j + s->n] += s->rho_inv_vec[j] * s->sol[j + s->n];
        }
    }

    return 0;
}